

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O1

void OutputNumber(ostream *strmOut,int nValue,int nSpaces)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  if (0 < nSpaces) {
    uVar1 = (uint)(nValue < 100000000);
    if (9999999 < nValue) {
      uVar1 = -(uint)(99999999 < nValue);
    }
    auVar5._0_4_ = -(uint)(999999 < nValue);
    auVar5._4_4_ = -(uint)(99999 < nValue);
    auVar5._8_4_ = -(uint)(9999 < nValue);
    auVar5._12_4_ = -(uint)(999 < nValue);
    uVar2 = movmskps((uint)(nValue < 100),auVar5);
    iVar3 = (nValue < 10) + uVar1 + (uint)(nValue < 100) + nSpaces +
            ((uint)(0x4332322132212110 >> ((byte)((uVar2 ^ 0xf) << 2) & 0x3f)) & 7);
    iVar4 = iVar3 + -8;
    if (-1 < iVar4) {
      if (iVar3 != 8) {
        iVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
          iVar3 = iVar3 + 1;
        } while (iVar3 < iVar4);
      }
      std::ostream::operator<<(strmOut,nValue);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
    if (nSpaces != 1) {
      iVar3 = nSpaces + -1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(strmOut,"*",1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

void OutputNumber(std::ostream& strmOut, int nValue, int nSpaces)
{
	if (nSpaces < 1)
		return;

	Assert(nSpaces < 8);

	int cSpaces = 0;
	if (nValue >= 100000000)
		cSpaces--;
	if (nValue < 10000000)
		cSpaces++;
	if (nValue < 1000000)
		cSpaces++;
	if (nValue < 100000)
		cSpaces++;
	if (nValue < 10000)
		cSpaces++;
	if (nValue < 1000)
		cSpaces++;
	if (nValue < 100)
		cSpaces++;
	if (nValue < 10)
		cSpaces++;

	cSpaces = cSpaces - (8 - nSpaces);

	if (cSpaces < 0)
	{
		strmOut << " ";
		for (int i = 1; i < nSpaces; i++) strmOut << "*";
		return;
	}

	for (int i = 0; i < cSpaces; i++) strmOut << " ";
	strmOut << nValue;
}